

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzerSettings.cpp
# Opt level: O0

void __thiscall I2sAnalyzerSettings::LoadSettings(I2sAnalyzerSettings *this,char *settings)

{
  byte bVar1;
  int iVar2;
  PcmWordSelectInverted local_40;
  Sign local_3c;
  PcmWordSelectInverted word_inverted;
  Sign sign;
  char *name_string;
  SimpleArchive local_20 [8];
  SimpleArchive text_archive;
  char *settings_local;
  I2sAnalyzerSettings *this_local;
  
  _text_archive = settings;
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,(char **)&word_inverted);
  iVar2 = strcmp(_word_inverted,"SaleaeI2sPcmAnalyzer");
  if (iVar2 != 0) {
    AnalyzerHelpers::Assert
              ("SaleaeI2sPcmAnalyzer: Provided with a settings string that doesn\'t belong to us;");
  }
  SimpleArchive::operator>>(local_20,&this->mClockChannel);
  SimpleArchive::operator>>(local_20,&this->mFrameChannel);
  SimpleArchive::operator>>(local_20,&this->mDataChannel);
  SimpleArchive::operator>>(local_20,&this->mShiftOrder);
  SimpleArchive::operator>>(local_20,&this->mDataValidEdge);
  SimpleArchive::operator>>(local_20,&this->mBitsPerWord);
  SimpleArchive::operator>>(local_20,&this->mWordAlignment);
  SimpleArchive::operator>>(local_20,&this->mFrameType);
  SimpleArchive::operator>>(local_20,&this->mBitAlignment);
  bVar1 = SimpleArchive::operator>>(local_20,&local_3c);
  if ((bVar1 & 1) != 0) {
    this->mSigned = local_3c;
  }
  bVar1 = SimpleArchive::operator>>(local_20,&local_40);
  if ((bVar1 & 1) != 0) {
    this->mWordSelectInverted = local_40;
  }
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mFrameChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDataChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void I2sAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    const char* name_string; // the first thing in the archive is the name of the protocol analyzer that the data belongs to.
    text_archive >> &name_string;
    if( strcmp( name_string, "SaleaeI2sPcmAnalyzer" ) != 0 )
        AnalyzerHelpers::Assert( "SaleaeI2sPcmAnalyzer: Provided with a settings string that doesn't belong to us;" );

    text_archive >> mClockChannel;
    text_archive >> mFrameChannel;
    text_archive >> mDataChannel;

    text_archive >> *( U32* )&mShiftOrder;
    text_archive >> *( U32* )&mDataValidEdge;
    text_archive >> mBitsPerWord;

    text_archive >> *( U32* )&mWordAlignment;
    text_archive >> *( U32* )&mFrameType;
    text_archive >> *( U32* )&mBitAlignment;

    // check to make sure loading it actual works befor assigning the result -- do this when adding settings to an anylzer which has been
    // previously released.
    AnalyzerEnums::Sign sign;
    if( text_archive >> *( U32* )&sign )
        mSigned = sign;

    PcmWordSelectInverted word_inverted;
    if( text_archive >> *( U32* )&word_inverted )
        mWordSelectInverted = word_inverted;

    ClearChannels();
    AddChannel( mClockChannel, "PCM CLOCK", true );
    AddChannel( mFrameChannel, "PCM FRAME", true );
    AddChannel( mDataChannel, "PCM DATA", true );

    UpdateInterfacesFromSettings();
}